

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RenderDeviceVkImpl.cpp
# Opt level: O0

void __thiscall
Diligent::RenderDeviceVkImpl::CreateTexture
          (RenderDeviceVkImpl *this,TextureDesc *TexDesc,VkImage vkImgHandle,
          RESOURCE_STATE InitialState,TextureVkImpl **ppTexture)

{
  anon_class_40_5_46582c24 ConstructObject;
  TextureVkImpl **local_30;
  TextureVkImpl **ppTexture_local;
  VkImage pVStack_20;
  RESOURCE_STATE InitialState_local;
  VkImage vkImgHandle_local;
  TextureDesc *TexDesc_local;
  RenderDeviceVkImpl *this_local;
  
  ConstructObject.TexDesc = TexDesc;
  ConstructObject.this = this;
  ConstructObject.InitialState = (RESOURCE_STATE *)((long)&ppTexture_local + 4);
  ConstructObject.vkImgHandle = &stack0xffffffffffffffe0;
  ConstructObject.ppTexture = &local_30;
  local_30 = ppTexture;
  ppTexture_local._4_4_ = InitialState;
  pVStack_20 = vkImgHandle;
  vkImgHandle_local = (VkImage)TexDesc;
  TexDesc_local = (TextureDesc *)this;
  RenderDeviceBase<Diligent::EngineVkImplTraits>::
  CreateDeviceObject<Diligent::TextureVkImpl,Diligent::TextureDesc,Diligent::RenderDeviceVkImpl::CreateTexture(Diligent::TextureDesc_const&,VkImage_T*,Diligent::RESOURCE_STATE,Diligent::TextureVkImpl**)::__0>
            ((RenderDeviceBase<Diligent::EngineVkImplTraits> *)this,"texture",TexDesc,ppTexture,
             ConstructObject);
  return;
}

Assistant:

void RenderDeviceVkImpl::CreateTexture(const TextureDesc& TexDesc, VkImage vkImgHandle, RESOURCE_STATE InitialState, class TextureVkImpl** ppTexture)
{
    CreateDeviceObject(
        "texture", TexDesc, ppTexture,
        [&]() //
        {
            TextureVkImpl* pTextureVk = NEW_RC_OBJ(m_TexObjAllocator, "TextureVkImpl instance", TextureVkImpl)(m_TexViewObjAllocator, this, TexDesc, InitialState, std::move(vkImgHandle));
            pTextureVk->QueryInterface(IID_TextureVk, reinterpret_cast<IObject**>(ppTexture));
        } //
    );
}